

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O0

void append_one(bson *bs,lua_State *L,char *key,size_t sz)

{
  lua_State *b;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int off;
  char *str_1;
  size_t len_1;
  size_t i;
  uint32_t *ts_1;
  uint32_t *inc;
  int64_t v;
  uint32_t *ts;
  char *pcStack_50;
  int subt;
  char *str;
  size_t len;
  int *piStack_38;
  int32_t sz_1;
  int32_t *doc;
  size_t sStack_28;
  int vt;
  size_t sz_local;
  char *key_local;
  lua_State *L_local;
  bson *bs_local;
  
  sStack_28 = sz;
  sz_local = (size_t)key;
  key_local = (char *)L;
  L_local = (lua_State *)bs;
  doc._4_4_ = lua_type(L,-1);
  pcVar2 = key_local;
  switch(doc._4_4_) {
  case 1:
    append_key((bson *)L_local,8,(char *)sz_local,sStack_28);
    b = L_local;
    iVar1 = lua_toboolean((lua_State *)key_local,-1);
    write_byte((bson *)b,(uint8_t)iVar1);
    break;
  default:
    pcVar3 = lua_typename((lua_State *)key_local,doc._4_4_);
    luaL_error((lua_State *)pcVar2,"Invalid value type : %s",pcVar3);
    break;
  case 3:
    append_number((bson *)L_local,(lua_State *)key_local,(char *)sz_local,sStack_28);
    break;
  case 4:
    pcStack_50 = lua_tolstring((lua_State *)key_local,-1,(size_t *)&str);
    if ((str < (char *)0x2) || (*pcStack_50 != '\0')) {
      pcVar2 = lua_tolstring((lua_State *)key_local,-1,(size_t *)&str_1);
      append_key((bson *)L_local,2,(char *)sz_local,sStack_28);
      iVar1 = reserve_length((bson *)L_local);
      write_string((bson *)L_local,pcVar2,(size_t)str_1);
      write_length((bson *)L_local,(int)str_1 + 1,iVar1);
    }
    else {
      ts._4_4_ = (uint)(byte)pcStack_50[1];
      append_key((bson *)L_local,ts._4_4_,(char *)sz_local,sStack_28);
      if (ts._4_4_ == 5) {
        write_binary((bson *)L_local,pcStack_50 + 2,(size_t)(str + -2));
      }
      else {
        if (ts._4_4_ == 7) {
          if (str != (char *)0xe) {
            luaL_error((lua_State *)key_local,"Invalid object id %s",pcStack_50 + 2);
          }
        }
        else {
          if (ts._4_4_ == 9) {
            if (str != (char *)0x6) {
              luaL_error((lua_State *)key_local,"Invalid date");
            }
            v = (int64_t)(pcStack_50 + 2);
            inc = (uint32_t *)((ulong)*(uint *)v * 1000);
            write_int64((bson *)L_local,(int64_t)inc);
            return;
          }
          if (ts._4_4_ == 10) {
            return;
          }
          if (ts._4_4_ == 0xb) {
            pcStack_50 = pcStack_50 + 2;
            str = str + -3;
            len_1 = 0;
            while ((len_1 < str && (pcStack_50[(long)(str + (-1 - len_1))] != '\0'))) {
              len_1 = len_1 + 1;
            }
            write_string((bson *)L_local,pcStack_50,(size_t)(str + (-1 - len_1)));
            write_string((bson *)L_local,pcStack_50 + (long)str + -len_1,len_1);
            return;
          }
          if (3 < ts._4_4_ - 0xc) {
            if (ts._4_4_ == 0x11) {
              if (str != (char *)0xa) {
                luaL_error((lua_State *)key_local,"Invalid timestamp");
              }
              ts_1 = (uint32_t *)(pcStack_50 + 2);
              i = (size_t)(pcStack_50 + 6);
              write_int32((bson *)L_local,*ts_1);
              write_int32((bson *)L_local,*(int32_t *)i);
              return;
            }
            if (ts._4_4_ == 0x7f) {
              return;
            }
            if (ts._4_4_ == 0xff) {
              return;
            }
            luaL_error((lua_State *)key_local,"Invalid subtype %d",(ulong)ts._4_4_);
            return;
          }
        }
        bson_reserve((bson *)L_local,(int)str + -2);
        memcpy((void *)(*(long *)&L_local->tt + (long)*(int *)&L_local->next),pcStack_50 + 2,
               (size_t)(str + -2));
        *(int *)&L_local->next = *(int *)&L_local->next + (int)str + -2;
      }
    }
    break;
  case 5:
    append_table((bson *)L_local,(lua_State *)key_local,(char *)sz_local,sStack_28);
    break;
  case 7:
    append_key((bson *)L_local,3,(char *)sz_local,sStack_28);
    piStack_38 = (int *)lua_touserdata((lua_State *)key_local,-1);
    len._4_4_ = *piStack_38;
    bson_reserve((bson *)L_local,len._4_4_);
    memcpy((void *)(*(long *)&L_local->tt + (long)*(int *)&L_local->next),piStack_38,(long)len._4_4_
          );
    *(int *)&L_local->next = len._4_4_ + *(int *)&L_local->next;
  }
  return;
}

Assistant:

static void
append_one(struct bson *bs, lua_State *L, const char *key, size_t sz) {
	int vt = lua_type(L,-1);
	switch(vt) {
	case LUA_TNUMBER:
		append_number(bs, L, key, sz);
		break;
	case LUA_TUSERDATA: {
		append_key(bs, BSON_DOCUMENT, key, sz);
		int32_t * doc = lua_touserdata(L,-1);
		int32_t sz = *doc;
		bson_reserve(bs,sz);
		memcpy(bs->ptr + bs->size, doc, sz);
		bs->size += sz;
		break;
	}
	case LUA_TSTRING: {
		size_t len;
		const char * str = lua_tolstring(L,-1,&len);
		if (len > 1 && str[0]==0) {
			int subt = (uint8_t)str[1];
			append_key(bs, subt, key, sz);
			switch(subt) {
			case BSON_BINARY:
				write_binary(bs, str+2, len-2);
				break;
			case BSON_OBJECTID:
				if (len != 2+12) {
					luaL_error(L, "Invalid object id %s", str+2);
				}
				// go though
			case BSON_JSCODE:
			case BSON_DBPOINTER:
			case BSON_SYMBOL:
			case BSON_CODEWS:
				bson_reserve(bs,len-2);
				memcpy(bs->ptr + bs->size, str+2, len-2);
				bs->size += len-2;
				break;
			case BSON_DATE: {
				if (len != 2+4) {
					luaL_error(L, "Invalid date");
				}
				const uint32_t * ts = (const uint32_t *)(str + 2);
				int64_t v = (int64_t)*ts * 1000;
				write_int64(bs, v);
				break;
			}
			case BSON_TIMESTAMP: {
				if (len != 2+8) {
					luaL_error(L, "Invalid timestamp");
				}
				const uint32_t * inc = (const uint32_t *)(str + 2);
				const uint32_t * ts = (const uint32_t *)(str + 6);
				write_int32(bs, *inc);
				write_int32(bs, *ts);
				break;
			}
			case BSON_REGEX: {
				str+=2;
				len-=3;
				size_t i;
				for (i=0;i<len;i++) {
					if (str[len-i-1]==0) {
						break;
					}
				}
				write_string(bs, str, len-i-1);
				write_string(bs, str + len-i, i);
				break;
			}
			case BSON_MINKEY:
			case BSON_MAXKEY:
			case BSON_NULL:
				break;
			default:
				luaL_error(L,"Invalid subtype %d", subt);
			}
		} else {
			size_t len;
			const char * str = lua_tolstring(L,-1,&len);
			append_key(bs, BSON_STRING, key, sz);
			int off = reserve_length(bs);
			write_string(bs, str, len);
			write_length(bs, len+1, off);		
		}
		break;
	}
	case LUA_TTABLE:
		append_table(bs, L, key, sz);
		break;
	case LUA_TBOOLEAN:
		append_key(bs, BSON_BOOLEAN, key, sz);
		write_byte(bs, lua_toboolean(L,-1));
		break;
	default:
		luaL_error(L, "Invalid value type : %s", lua_typename(L,vt));
	}
}